

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupLevelized(Aig_Man_t *p)

{
  int iVar1;
  Aig_Type_t Type;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t **ppAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Vec_Vec_t *p_01;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *p1;
  Tim_Man_t *pTVar10;
  int local_38;
  int local_34;
  int k;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Vec_t *vLevels;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar4;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar5 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    p_00->pEquivs = ppAVar5;
    ppAVar5 = p_00->pEquivs;
    iVar1 = Aig_ManObjNumMax(p);
    memset(ppAVar5,0,(long)iVar1 << 3);
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar5 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    p_00->pReprs = ppAVar5;
    ppAVar5 = p_00->pReprs;
    iVar1 = Aig_ManObjNumMax(p);
    memset(ppAVar5,0,(long)iVar1 << 3);
  }
  pAVar6 = Aig_ManConst1(p_00);
  pAVar7 = Aig_ManConst1(p);
  (pAVar7->field_5).pData = pAVar6;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar8 = Vec_PtrEntry(p->vCis,local_34);
    pAVar6 = Aig_ObjCreateCi(p_00);
    *(ulong *)&pAVar6->field_0x18 =
         *(ulong *)&pAVar6->field_0x18 & 0xff000000ffffffff |
         (ulong)((uint)((ulong)*(undefined8 *)((long)pvVar8 + 0x18) >> 0x20) & 0xffffff) << 0x20;
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  p_01 = Aig_ManLevelize(p);
  for (local_34 = 0; iVar1 = Vec_VecSize(p_01), local_34 < iVar1; local_34 = local_34 + 1) {
    local_38 = 0;
    while( true ) {
      pVVar9 = Vec_VecEntry(p_01,local_34);
      iVar1 = Vec_PtrSize(pVVar9);
      if (iVar1 <= local_38) break;
      pVVar9 = Vec_VecEntry(p_01,local_34);
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar9,local_38);
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      p1 = Aig_ObjChild1Copy(pAVar6);
      Type = Aig_ObjType(pAVar6);
      pAVar7 = Aig_Oper(p_00,pAVar7,p1,Type);
      (pAVar6->field_5).pData = pAVar7;
      local_38 = local_38 + 1;
    }
  }
  Vec_VecFree(p_01);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCos), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
    pAVar7 = Aig_ObjChild0Copy(pAVar6);
    pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
    (pAVar6->field_5).pData = pAVar7;
  }
  iVar1 = Aig_ManBufNum(p);
  if (iVar1 == 0) {
    iVar1 = Aig_ManNodeNum(p);
    iVar2 = Aig_ManNodeNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDup.c"
                    ,0x32b,"Aig_Man_t *Aig_ManDupLevelized(Aig_Man_t *)");
    }
  }
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  if (p->pManTime != (void *)0x0) {
    pTVar10 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar10;
  }
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManDupLevelized(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupLevelized( Aig_Man_t * p )
{
    Vec_Vec_t * vLevels;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
    {
        pNew->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    if ( p->pReprs )
    {
        pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    vLevels = Aig_ManLevelize( p );
    Vec_VecForEachEntry( Aig_Obj_t *, vLevels, pObj, i, k )
    {
        pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        pObj->pData = pObjNew;
    }
    Vec_VecFree( vLevels );
    // duplicate POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
//    if ( (nNodes = Aig_ManCleanup( pNew )) )
//        printf( "Aig_ManDupLevelized(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupLevelized(): The check has failed.\n" );
    return pNew;
}